

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O2

VP8StatusCode WebPCopyDecBufferPixels(WebPDecBuffer *src_buf,WebPDecBuffer *dst_buf)

{
  WEBP_CSP_MODE WVar1;
  VP8StatusCode VVar2;
  int dst_stride;
  uint8_t *dst;
  int iVar3;
  int src_stride;
  uint8_t *src;
  int height;
  
  iVar3 = src_buf->width;
  dst_buf->width = iVar3;
  height = src_buf->height;
  dst_buf->height = height;
  VVar2 = CheckDecBuffer(dst_buf);
  if (VVar2 == VP8_STATUS_OK) {
    src = (src_buf->u).RGBA.rgba;
    dst = (dst_buf->u).RGBA.rgba;
    if ((ulong)src_buf->colorspace < 0xb) {
      src_stride = (src_buf->u).RGBA.stride;
      dst_stride = (dst_buf->u).RGBA.stride;
      iVar3 = iVar3 * (uint)"\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"
                            [src_buf->colorspace];
    }
    else {
      WebPCopyPlane(src,(src_buf->u).YUVA.y_stride,dst,(dst_buf->u).YUVA.y_stride,iVar3,height);
      WebPCopyPlane((src_buf->u).YUVA.u,(src_buf->u).YUVA.u_stride,(dst_buf->u).YUVA.u,
                    (dst_buf->u).YUVA.u_stride,(src_buf->width + 1) / 2,(src_buf->height + 1) / 2);
      WebPCopyPlane((src_buf->u).YUVA.v,(src_buf->u).YUVA.v_stride,(dst_buf->u).YUVA.v,
                    (dst_buf->u).YUVA.v_stride,(src_buf->width + 1) / 2,(src_buf->height + 1) / 2);
      WVar1 = src_buf->colorspace;
      if (((MODE_YUVA < WVar1) || ((0x103aU >> (WVar1 & 0x1f) & 1) == 0)) &&
         (WVar1 - MODE_YUV < 0xfffffffc)) {
        return VP8_STATUS_OK;
      }
      src = (src_buf->u).YUVA.a;
      src_stride = (src_buf->u).YUVA.a_stride;
      dst = (dst_buf->u).YUVA.a;
      dst_stride = (dst_buf->u).YUVA.a_stride;
      iVar3 = src_buf->width;
      height = src_buf->height;
    }
    WebPCopyPlane(src,src_stride,dst,dst_stride,iVar3,height);
    VVar2 = VP8_STATUS_OK;
  }
  else {
    VVar2 = VP8_STATUS_INVALID_PARAM;
  }
  return VVar2;
}

Assistant:

VP8StatusCode WebPCopyDecBufferPixels(const WebPDecBuffer* const src_buf,
                                      WebPDecBuffer* const dst_buf) {
  assert(src_buf != NULL && dst_buf != NULL);
  assert(src_buf->colorspace == dst_buf->colorspace);

  dst_buf->width = src_buf->width;
  dst_buf->height = src_buf->height;
  if (CheckDecBuffer(dst_buf) != VP8_STATUS_OK) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (WebPIsRGBMode(src_buf->colorspace)) {
    const WebPRGBABuffer* const src = &src_buf->u.RGBA;
    const WebPRGBABuffer* const dst = &dst_buf->u.RGBA;
    WebPCopyPlane(src->rgba, src->stride, dst->rgba, dst->stride,
                  src_buf->width * kModeBpp[src_buf->colorspace],
                  src_buf->height);
  } else {
    const WebPYUVABuffer* const src = &src_buf->u.YUVA;
    const WebPYUVABuffer* const dst = &dst_buf->u.YUVA;
    WebPCopyPlane(src->y, src->y_stride, dst->y, dst->y_stride,
                  src_buf->width, src_buf->height);
    WebPCopyPlane(src->u, src->u_stride, dst->u, dst->u_stride,
                  (src_buf->width + 1) / 2, (src_buf->height + 1) / 2);
    WebPCopyPlane(src->v, src->v_stride, dst->v, dst->v_stride,
                  (src_buf->width + 1) / 2, (src_buf->height + 1) / 2);
    if (WebPIsAlphaMode(src_buf->colorspace)) {
      WebPCopyPlane(src->a, src->a_stride, dst->a, dst->a_stride,
                    src_buf->width, src_buf->height);
    }
  }
  return VP8_STATUS_OK;
}